

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,size_t size,align_spec *spec,inf_or_nan_writer f)

{
  uint uVar1;
  wchar_t wVar2;
  alignment aVar3;
  type __n;
  wchar_t *pwVar4;
  inf_or_nan_writer *this_00;
  align_spec *in_RDX;
  ulong in_RSI;
  wchar_t **in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  uint width;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t *__first;
  
  uVar1 = align_spec::width(in_RDX);
  if (in_RSI < uVar1) {
    __n = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
          reserve(in_stack_ffffffffffffffa0,(size_t)in_RDI);
    __first = (wchar_t *)&stack0xffffffffffffffb8;
    wVar2 = align_spec::fill(in_RDX);
    aVar3 = align_spec::align(in_RDX);
    if (aVar3 == ALIGN_RIGHT) {
      pwVar4 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         (__first,(unsigned_long)__n,
                          (wchar_t *)CONCAT44(wVar2,in_stack_ffffffffffffffb0));
      *(wchar_t **)__first = pwVar4;
      inf_or_nan_writer::operator()((inf_or_nan_writer *)in_stack_ffffffffffffffa0,in_RDI);
    }
    else {
      aVar3 = align_spec::align(in_RDX);
      if (aVar3 == ALIGN_CENTER) {
        this_00 = (inf_or_nan_writer *)(uVar1 - in_RSI >> 1);
        pwVar4 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (__first,(unsigned_long)__n,
                            (wchar_t *)CONCAT44(wVar2,in_stack_ffffffffffffffb0));
        *(wchar_t **)__first = pwVar4;
        inf_or_nan_writer::operator()(this_00,in_RDI);
        pwVar4 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (__first,(unsigned_long)__n,
                            (wchar_t *)CONCAT44(wVar2,in_stack_ffffffffffffffb0));
        *(wchar_t **)__first = pwVar4;
      }
      else {
        inf_or_nan_writer::operator()((inf_or_nan_writer *)in_stack_ffffffffffffffa0,in_RDI);
        pwVar4 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (__first,(unsigned_long)__n,
                            (wchar_t *)CONCAT44(wVar2,in_stack_ffffffffffffffb0));
        *(wchar_t **)__first = pwVar4;
      }
    }
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::reserve
              (in_stack_ffffffffffffffa0,(size_t)in_RDI);
    inf_or_nan_writer::operator()((inf_or_nan_writer *)in_stack_ffffffffffffffa0,in_RDI);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}